

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkLayer::set_name(NeuralNetworkLayer *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/src/../build/format/NeuralNetwork.pb.h"
               ,0x5cce);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,value,(allocator<char> *)&local_51);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void NeuralNetworkLayer::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.NeuralNetworkLayer.name)
}